

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O1

int initiate_socket_connection(SOCKET_IO_INSTANCE *socket_io_instance)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  LOGGER_LOG p_Var6;
  addrinfo *paVar7;
  NETWORK_INTERFACE_DESCRIPTION *nid;
  char *pcVar8;
  char *__dest;
  int *piVar9;
  int iVar10;
  socklen_t __len;
  long lVar11;
  sockaddr *__addr;
  char *pcVar12;
  NETWORK_INTERFACE_DESCRIPTION *unaff_R12;
  char *__src;
  NETWORK_INTERFACE_DESCRIPTION *pNVar13;
  bool bVar14;
  ifreq ifr;
  ifconf ifc;
  sockaddr_un addrInfoUn;
  char *in_stack_fffffffffffffad8;
  undefined4 uVar15;
  undefined8 in_stack_fffffffffffffae0;
  char local_4e0 [18];
  byte local_4ce;
  byte local_4cd;
  in_addr local_4cc;
  int local_4b8;
  char *local_4b0;
  sockaddr local_4a8;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 uStack_458;
  undefined6 uStack_450;
  undefined2 local_44a;
  undefined6 uStack_448;
  undefined8 uStack_442;
  char local_438 [1032];
  
  if (socket_io_instance->address_type == ADDRESS_TYPE_IP) {
    _Var1 = dns_resolver_is_lookup_complete(socket_io_instance->dns_resolver);
    if (_Var1) {
      paVar7 = dns_resolver_get_addrInfo(socket_io_instance->dns_resolver);
      if (paVar7 != (addrinfo *)0x0) {
        iVar2 = 0;
        bVar14 = true;
        goto LAB_0010b384;
      }
      p_Var6 = xlogging_get_log_function();
      iVar2 = 0x217;
      if (p_Var6 != (LOGGER_LOG)0x0) {
        in_stack_fffffffffffffad8 = socket_io_instance->hostname;
        pcVar12 = "DNS resolution failed. Hostname:%s";
        iVar3 = 0x216;
        goto LAB_0010b372;
      }
    }
    else {
      p_Var6 = xlogging_get_log_function();
      iVar2 = 0x20e;
      if (p_Var6 != (LOGGER_LOG)0x0) {
        in_stack_fffffffffffffad8 = socket_io_instance->hostname;
        pcVar12 = "DNS did not resolve hostname IP address. Hostname:%s";
        iVar3 = 0x20d;
        goto LAB_0010b372;
      }
    }
LAB_0010b382:
    paVar7 = (addrinfo *)0x0;
    bVar14 = false;
  }
  else {
    pcVar12 = socket_io_instance->hostname;
    if (pcVar12 == (char *)0x0) {
      p_Var6 = xlogging_get_log_function();
      iVar2 = 0x235;
      if (p_Var6 != (LOGGER_LOG)0x0) {
        pcVar12 = "Hostname is NULL";
        iVar3 = 0x234;
LAB_0010b372:
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                  ,"initiate_socket_connection",iVar3,1,pcVar12);
      }
      goto LAB_0010b382;
    }
    sVar5 = strlen(pcVar12);
    if (sVar5 - 0x6c < 0xffffffffffffff93) {
      p_Var6 = xlogging_get_log_function();
      iVar2 = 0x227;
      if (p_Var6 != (LOGGER_LOG)0x0) {
        in_stack_fffffffffffffad8 = socket_io_instance->hostname;
        in_stack_fffffffffffffae0 = 0;
        pcVar12 = "Hostname %s is too long for a unix socket (max len = %lu)";
        iVar3 = 0x226;
        goto LAB_0010b372;
      }
      goto LAB_0010b382;
    }
    local_4a8.sa_data[6] = '\0';
    local_4a8.sa_data[7] = '\0';
    local_4a8.sa_data[8] = '\0';
    local_4a8.sa_data[9] = '\0';
    local_4a8.sa_data[10] = '\0';
    local_4a8.sa_data[0xb] = '\0';
    local_4a8.sa_data[0xc] = '\0';
    local_4a8.sa_data[0xd] = '\0';
    uStack_448 = 0;
    uStack_442 = 0;
    uStack_458 = 0;
    uStack_450 = 0;
    local_44a = 0;
    local_468 = 0;
    uStack_460 = 0;
    local_478 = 0;
    uStack_470 = 0;
    local_488 = 0;
    uStack_480 = 0;
    local_498 = 0;
    uStack_490 = 0;
    local_4a8.sa_family = 1;
    local_4a8.sa_data[0] = '\0';
    local_4a8.sa_data[1] = '\0';
    local_4a8.sa_data[2] = '\0';
    local_4a8.sa_data[3] = '\0';
    local_4a8.sa_data[4] = '\0';
    local_4a8.sa_data[5] = '\0';
    memcpy(local_4a8.sa_data,pcVar12,sVar5);
    paVar7 = (addrinfo *)0x0;
    bVar14 = true;
    iVar2 = 0;
  }
LAB_0010b384:
  if (!bVar14) {
    return iVar2;
  }
  if (socket_io_instance->address_type == ADDRESS_TYPE_IP) {
    iVar2 = paVar7->ai_family;
    iVar3 = paVar7->ai_socktype;
    iVar10 = paVar7->ai_protocol;
  }
  else {
    iVar2 = 1;
    iVar3 = 1;
    iVar10 = 0;
  }
  iVar2 = socket(iVar2,iVar3,iVar10);
  socket_io_instance->socket = iVar2;
  if (iVar2 < 0) {
    p_Var6 = xlogging_get_log_function();
    iVar2 = 0x247;
    if (p_Var6 == (LOGGER_LOG)0x0) {
LAB_0010bc19:
      bVar14 = false;
      goto LAB_0010bc1c;
    }
    pcVar12 = "Failure: socket create failure %d.";
    iVar3 = 0x246;
  }
  else {
    pcVar12 = socket_io_instance->target_mac_address;
    if (pcVar12 == (char *)0x0) {
LAB_0010bb19:
      uVar4 = fcntl(socket_io_instance->socket,3,0);
      if ((uVar4 == 0xffffffff) ||
         (iVar2 = fcntl(socket_io_instance->socket,4,(ulong)(uVar4 | 0x800)), iVar2 == -1)) {
        p_Var6 = xlogging_get_log_function();
        iVar2 = 0x255;
        if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0010bc19;
        pcVar12 = "Failure: fcntl failure.";
        iVar3 = 0x254;
      }
      else {
        if (socket_io_instance->address_type == ADDRESS_TYPE_IP) {
          __addr = (sockaddr *)paVar7->ai_addr;
          __len = paVar7->ai_addrlen;
        }
        else {
          __addr = &local_4a8;
          __len = 0x6e;
        }
        iVar2 = connect(socket_io_instance->socket,__addr,__len);
        if ((iVar2 == 0) || (piVar9 = __errno_location(), *piVar9 == 0x73)) {
          bVar14 = true;
          iVar2 = 0;
          if (socket_io_instance->on_io_open_complete != (ON_IO_OPEN_COMPLETE)0x0) {
            (*socket_io_instance->on_io_open_complete)
                      (socket_io_instance->on_io_open_complete_context,IO_OPEN_OK);
            iVar2 = 0;
          }
          goto LAB_0010bc1c;
        }
        p_Var6 = xlogging_get_log_function();
        iVar2 = 0x265;
        if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0010bc19;
        pcVar12 = "Failure: connect failure %d.";
        iVar3 = 0x264;
      }
    }
    else {
      local_4b8 = 0x400;
      local_4b0 = local_438;
      iVar10 = 0;
      iVar3 = ioctl(iVar2,0x8912);
      if (iVar3 == -1) {
        p_Var6 = xlogging_get_log_function();
        uVar15 = (undefined4)((ulong)in_stack_fffffffffffffad8 >> 0x20);
        iVar10 = 0x199;
        if (p_Var6 != (LOGGER_LOG)0x0) {
          piVar9 = __errno_location();
          in_stack_fffffffffffffad8 = (char *)CONCAT44(uVar15,*piVar9);
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                    ,"get_network_interface_descriptions",0x198,1,
                    "ioctl failed querying socket (SIOCGIFCONF, errno=%d)",in_stack_fffffffffffffad8
                   );
        }
      }
      else {
        bVar14 = (ulong)(long)local_4b8 < 0x28;
        if (bVar14) {
          unaff_R12 = (NETWORK_INTERFACE_DESCRIPTION *)0x0;
        }
        else {
          lVar11 = ((ulong)(long)local_4b8 / 0x28) * 0x28;
          bVar14 = false;
          unaff_R12 = (NETWORK_INTERFACE_DESCRIPTION *)0x0;
          __src = local_4b0;
          pNVar13 = (NETWORK_INTERFACE_DESCRIPTION *)0x0;
          do {
            strcpy(local_4e0,__src);
            iVar3 = ioctl(iVar2,0x8913,local_4e0);
            if (iVar3 != 0) {
              p_Var6 = xlogging_get_log_function();
              uVar15 = (undefined4)((ulong)in_stack_fffffffffffffad8 >> 0x20);
              if (p_Var6 != (LOGGER_LOG)0x0) {
                piVar9 = __errno_location();
                in_stack_fffffffffffffad8 = (char *)CONCAT44(uVar15,*piVar9);
                (*p_Var6)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                          ,"get_network_interface_descriptions",0x1ab,1,
                          "ioctl failed querying socket (SIOCGIFFLAGS, errno=%d)",
                          in_stack_fffffffffffffad8);
              }
              iVar10 = 0x1ac;
              goto LAB_0010b9b0;
            }
            iVar3 = ioctl(iVar2,0x8927,local_4e0);
            if (iVar3 != 0) {
              p_Var6 = xlogging_get_log_function();
              uVar15 = (undefined4)((ulong)in_stack_fffffffffffffad8 >> 0x20);
              if (p_Var6 != (LOGGER_LOG)0x0) {
                piVar9 = __errno_location();
                in_stack_fffffffffffffad8 = (char *)CONCAT44(uVar15,*piVar9);
                (*p_Var6)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                          ,"get_network_interface_descriptions",0x1b1,1,
                          "ioctl failed querying socket (SIOCGIFHWADDR, errno=%d)",
                          in_stack_fffffffffffffad8);
              }
              iVar10 = 0x1b2;
              goto LAB_0010b9b0;
            }
            iVar3 = ioctl(iVar2,0x8915,local_4e0);
            if (iVar3 != 0) {
              p_Var6 = xlogging_get_log_function();
              uVar15 = (undefined4)((ulong)in_stack_fffffffffffffad8 >> 0x20);
              if (p_Var6 != (LOGGER_LOG)0x0) {
                piVar9 = __errno_location();
                in_stack_fffffffffffffad8 = (char *)CONCAT44(uVar15,*piVar9);
                (*p_Var6)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                          ,"get_network_interface_descriptions",0x1b7,1,
                          "ioctl failed querying socket (SIOCGIFADDR, errno=%d)",
                          in_stack_fffffffffffffad8);
              }
              iVar10 = 0x1b8;
              goto LAB_0010b9b0;
            }
            nid = (NETWORK_INTERFACE_DESCRIPTION *)malloc(0x20);
            if (nid == (NETWORK_INTERFACE_DESCRIPTION *)0x0) {
              p_Var6 = xlogging_get_log_function();
              if (p_Var6 != (LOGGER_LOG)0x0) {
                (*p_Var6)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                          ,"create_network_interface_description",0x147,1,
                          "Failed allocating NETWORK_INTERFACE_DESCRIPTION");
              }
LAB_0010b81c:
              nid = (NETWORK_INTERFACE_DESCRIPTION *)0x0;
            }
            else {
              sVar5 = strlen(local_4e0);
              sVar5 = sVar5 + 1;
              if (sVar5 == 0) {
                sVar5 = 0xffffffffffffffff;
              }
              if (sVar5 == 0xffffffffffffffff) {
                p_Var6 = xlogging_get_log_function();
                if (p_Var6 != (LOGGER_LOG)0x0) {
                  iVar3 = 0x14b;
LAB_0010b6c2:
                  pcVar8 = "invalid malloc size";
LAB_0010b80f:
                  (*p_Var6)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                            ,"create_network_interface_description",iVar3,1,pcVar8);
                }
LAB_0010b814:
                destroy_network_interface_descriptions(nid);
                goto LAB_0010b81c;
              }
              pcVar8 = (char *)malloc(sVar5);
              nid->name = pcVar8;
              if (pcVar8 == (char *)0x0) {
                p_Var6 = xlogging_get_log_function();
                if (p_Var6 != (LOGGER_LOG)0x0) {
                  iVar3 = 0x151;
                  pcVar8 = "failed setting interface description name (malloc failed)";
                  goto LAB_0010b80f;
                }
                goto LAB_0010b814;
              }
              strcpy(pcVar8,local_4e0);
              pcVar8 = (char *)malloc(0x12);
              nid->mac_address = pcVar8;
              if (pcVar8 == (char *)0x0) {
                p_Var6 = xlogging_get_log_function();
                if (p_Var6 != (LOGGER_LOG)0x0) {
                  in_stack_fffffffffffffad8 = (char *)0x0;
                  iVar3 = 0x160;
                  pcVar8 = "failed formatting mac address (malloc failed) size:%zu";
                  goto LAB_0010b80f;
                }
                goto LAB_0010b814;
              }
              in_stack_fffffffffffffae0 =
                   CONCAT44((int)((ulong)in_stack_fffffffffffffae0 >> 0x20),local_4cc.s_addr >> 0x18
                           );
              in_stack_fffffffffffffad8 =
                   (char *)(CONCAT44((int)((ulong)in_stack_fffffffffffffad8 >> 0x20),
                                     local_4cc.s_addr >> 0x10) & 0xffffffff000000ff);
              iVar3 = sprintf(pcVar8,"%02X:%02X:%02X:%02X:%02X:%02X",(ulong)local_4ce,
                              (ulong)local_4cd,(ulong)(byte)local_4cc.s_addr,
                              (ulong)local_4cc.s_addr._1_1_,in_stack_fffffffffffffad8,
                              in_stack_fffffffffffffae0);
              if (iVar3 < 1) {
                p_Var6 = xlogging_get_log_function();
                if (p_Var6 != (LOGGER_LOG)0x0) {
                  iVar3 = 0x166;
                  pcVar8 = "failed formatting mac address (sprintf failed)";
                  goto LAB_0010b80f;
                }
                goto LAB_0010b814;
              }
              pcVar8 = inet_ntoa(local_4cc);
              if (pcVar8 == (char *)0x0) {
                p_Var6 = xlogging_get_log_function();
                if (p_Var6 != (LOGGER_LOG)0x0) {
                  iVar3 = 0x16c;
                  pcVar8 = "failed setting the ip address (inet_ntoa failed)";
                  goto LAB_0010b80f;
                }
                goto LAB_0010b814;
              }
              sVar5 = strlen(pcVar8);
              sVar5 = sVar5 + 1;
              if (sVar5 == 0) {
                sVar5 = 0xffffffffffffffff;
              }
              if (sVar5 == 0xffffffffffffffff) {
                p_Var6 = xlogging_get_log_function();
                if (p_Var6 != (LOGGER_LOG)0x0) {
                  iVar3 = 0x172;
                  goto LAB_0010b6c2;
                }
                goto LAB_0010b814;
              }
              __dest = (char *)malloc(sVar5);
              nid->ip_address = __dest;
              if (__dest == (char *)0x0) {
                p_Var6 = xlogging_get_log_function();
                if (p_Var6 != (LOGGER_LOG)0x0) {
                  iVar3 = 0x178;
                  pcVar8 = "failed setting the ip address (malloc failed)";
                  goto LAB_0010b80f;
                }
                goto LAB_0010b814;
              }
              strcpy(__dest,pcVar8);
              nid->next = (NETWORK_INTERFACE_DESCRIPTION_TAG *)0x0;
              if (pNVar13 != (NETWORK_INTERFACE_DESCRIPTION *)0x0) {
                pNVar13->next = nid;
              }
            }
            if (nid == (NETWORK_INTERFACE_DESCRIPTION *)0x0) {
              p_Var6 = xlogging_get_log_function();
              iVar10 = 0x1be;
              if (p_Var6 != (LOGGER_LOG)0x0) {
                (*p_Var6)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                          ,"get_network_interface_descriptions",0x1bd,1,
                          "Failed creating network interface description");
              }
              goto LAB_0010b9b0;
            }
            if (unaff_R12 == (NETWORK_INTERFACE_DESCRIPTION *)0x0) {
              unaff_R12 = nid;
            }
            __src = __src + 0x28;
            lVar11 = lVar11 + -0x28;
            bVar14 = lVar11 == 0;
            pNVar13 = nid;
          } while (!bVar14);
          iVar10 = 0;
        }
LAB_0010b9b0:
        if (!bVar14) {
          destroy_network_interface_descriptions(unaff_R12);
        }
      }
      pNVar13 = unaff_R12;
      if (iVar10 == 0) {
        for (; pNVar13 != (NETWORK_INTERFACE_DESCRIPTION *)0x0; pNVar13 = pNVar13->next) {
          iVar3 = strcmp(pcVar12,pNVar13->mac_address);
          uVar15 = (undefined4)((ulong)in_stack_fffffffffffffad8 >> 0x20);
          if (iVar3 == 0) {
            pcVar12 = pNVar13->name;
            sVar5 = strlen(pcVar12);
            iVar2 = setsockopt(iVar2,1,0x19,pcVar12,(socklen_t)sVar5);
            if (iVar2 != 0) {
              p_Var6 = xlogging_get_log_function();
              if (p_Var6 != (LOGGER_LOG)0x0) {
                piVar9 = __errno_location();
                (*p_Var6)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                          ,"set_target_network_interface",499,1,"setsockopt failed (%d)",
                          CONCAT44(uVar15,*piVar9));
              }
              goto LAB_0010bac6;
            }
            destroy_network_interface_descriptions(unaff_R12);
            goto LAB_0010bb19;
          }
        }
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 != (LOGGER_LOG)0x0) {
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                    ,"set_target_network_interface",0x1ee,1,
                    "Did not find a network interface matching MAC ADDRESS");
        }
LAB_0010bac6:
        destroy_network_interface_descriptions(unaff_R12);
      }
      else {
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 != (LOGGER_LOG)0x0) {
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                    ,"set_target_network_interface",0x1db,1,
                    "Failed getting network interface descriptions");
        }
      }
      p_Var6 = xlogging_get_log_function();
      iVar2 = 0x24e;
      if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0010bc19;
      pcVar12 = "Failure: failed selecting target network interface (MACADDR=%s).";
      iVar3 = 0x24d;
    }
  }
  bVar14 = false;
  (*p_Var6)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
            ,"initiate_socket_connection",iVar3,1,pcVar12);
LAB_0010bc1c:
  iVar3 = 0;
  if (!bVar14) {
    if (-1 < socket_io_instance->socket) {
      close(socket_io_instance->socket);
    }
    socket_io_instance->socket = -1;
    iVar3 = iVar2;
  }
  return iVar3;
}

Assistant:

static int initiate_socket_connection(SOCKET_IO_INSTANCE* socket_io_instance)
{
    int result;
    int flags;
    struct addrinfo* addr = NULL;
    struct sockaddr_un addrInfoUn;

    if(socket_io_instance->address_type == ADDRESS_TYPE_IP)
    {
        if(!dns_resolver_is_lookup_complete(socket_io_instance->dns_resolver))
        {
            LogError("DNS did not resolve hostname IP address. Hostname:%s", socket_io_instance->hostname);
            result = MU_FAILURE;
        }
        else
        {
            addr = dns_resolver_get_addrInfo(socket_io_instance->dns_resolver);

            if (addr == NULL)
            {
                LogError("DNS resolution failed. Hostname:%s", socket_io_instance->hostname);
                result = MU_FAILURE;
            } 
            else 
            {
                result = 0;
            }
        }
    }
    else
    {
        if (socket_io_instance->hostname != NULL)
        {
            size_t hostname_len = strlen(socket_io_instance->hostname);
            if (hostname_len + 1 > sizeof(addrInfoUn.sun_path))
            {
                LogError("Hostname %s is too long for a unix socket (max len = %lu)", socket_io_instance->hostname, (unsigned long)sizeof(addrInfoUn.sun_path));
                result = MU_FAILURE;
            }
            else
            {
                memset(&addrInfoUn, 0, sizeof(addrInfoUn));
                addrInfoUn.sun_family = AF_UNIX;
                // No need to add NULL terminator due to the above memset
                (void)memcpy(addrInfoUn.sun_path, socket_io_instance->hostname, hostname_len);
                result = 0;
            }
        }
        else
        {
            LogError("Hostname is NULL");
            result = MU_FAILURE;
        }
    }

    if(result == 0)
    {
        if (socket_io_instance->address_type == ADDRESS_TYPE_IP)
        {
            socket_io_instance->socket = socket(addr->ai_family, addr->ai_socktype, addr->ai_protocol);
        }
        else
        {
            socket_io_instance->socket = socket(AF_UNIX, SOCK_STREAM, 0);
        }

        if (socket_io_instance->socket < SOCKET_SUCCESS)
        {
            LogError("Failure: socket create failure %d.", socket_io_instance->socket);
            result = MU_FAILURE;
        }
        #ifndef __APPLE__
        else if (socket_io_instance->target_mac_address != NULL &&
                    set_target_network_interface(socket_io_instance->socket, socket_io_instance->target_mac_address) != 0)
        {
            LogError("Failure: failed selecting target network interface (MACADDR=%s).", socket_io_instance->target_mac_address);
            result = MU_FAILURE;
        }
        #endif //__APPLE__
        else if ((-1 == (flags = fcntl(socket_io_instance->socket, F_GETFL, 0))) ||
            (fcntl(socket_io_instance->socket, F_SETFL, flags | O_NONBLOCK) == -1))
        {
            LogError("Failure: fcntl failure.");
            result = MU_FAILURE;
        }
        else
        {
            if (socket_io_instance->address_type == ADDRESS_TYPE_IP)
            {
                result = connect(socket_io_instance->socket, addr->ai_addr, addr->ai_addrlen);
            }
            else
            {
                result = connect(socket_io_instance->socket, (struct sockaddr *)&addrInfoUn, sizeof(addrInfoUn));
            }

            if ((result != 0) && (errno != EINPROGRESS))
            {
                LogError("Failure: connect failure %d.", errno);
                result = MU_FAILURE;
            }
            else  // result == 0 || errno == EINPROGRESS
            {
                // Async connect will return -1.
                result = 0;
                if (socket_io_instance->on_io_open_complete != NULL)
                {
                    socket_io_instance->on_io_open_complete(socket_io_instance->on_io_open_complete_context, IO_OPEN_OK /*: IO_OPEN_ERROR*/);
                }
            }
        }

        if (result != 0)
        {
            if (socket_io_instance->socket >= SOCKET_SUCCESS)
            {
                close(socket_io_instance->socket);
            }
            socket_io_instance->socket = INVALID_SOCKET;
        }
    }

    return result;
}